

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsCoreSetGlobal(HelicsCore core,char *valueName,char *value,HelicsError *err)

{
  Core *pCVar1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    if (valueName == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Global name cannot be null";
      }
    }
    else {
      sVar2 = strlen(valueName);
      sVar3 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (value != (char *)0x0) {
        sVar3 = strlen(value);
        _Var4._M_p = value;
      }
      (*pCVar1->_vptr_Core[0x5a])(pCVar1,sVar2,valueName,sVar3,_Var4._M_p);
    }
  }
  return;
}

Assistant:

void helicsCoreSetGlobal(HelicsCore core, const char* valueName, const char* value, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    if (valueName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidGlobalString);
        return;
    }
    try {
        cppcore->setGlobal(valueName, AS_STRING_VIEW(value));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}